

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

size_t btreeblk_get_size(void *voidhandle,bid_t bid)

{
  uint uVar1;
  int iVar2;
  bid_t in_RSI;
  uint *in_RDI;
  btreeblk_handle *handle;
  size_t idx;
  size_t sb;
  bid_t _bid;
  size_t local_30;
  size_t local_28;
  bid_t local_20;
  bid_t local_18;
  ulong local_8;
  
  local_18 = in_RSI;
  iVar2 = is_subblock(in_RSI);
  if ((iVar2 == 0) || (local_18 == 0xffffffffffffffff)) {
    uVar1 = *in_RDI;
  }
  else {
    subbid2bid(local_18,&local_28,&local_30,&local_20);
    uVar1 = *(uint *)(*(long *)(in_RDI + 0x18) + local_28 * 0x18 + 8);
  }
  local_8 = (ulong)uVar1;
  return local_8;
}

Assistant:

size_t btreeblk_get_size(void *voidhandle, bid_t bid)
{
    bid_t _bid;
    size_t sb, idx;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (is_subblock(bid) && bid != BLK_NOT_FOUND) {
        subbid2bid(bid, &sb, &idx, &_bid);
        return handle->sb[sb].sb_size;
    } else {
        return handle->nodesize;
    }
}